

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

int CountTotalScopes(Lexer *lexer)

{
  Token TVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = 1;
  do {
    while( true ) {
      do {
        TVar1 = GetNextToken(lexer);
        uVar2 = TVar1 - CASE;
      } while (0x1e < uVar2);
      if ((0x8401a1U >> (uVar2 & 0x1f) & 1) == 0) break;
      iVar3 = iVar3 + 1;
    }
  } while (uVar2 != 0x1e);
  if (lexer->currentTokenString != (char *)0x0) {
    Free(lexer->currentTokenString);
  }
  return iVar3;
}

Assistant:

int CountTotalScopes(Lexer* lexer){
	int total = 1;
	Token tok = GetNextToken(lexer);
	while (tok != UNDEFINED){
		if (tok == CASE ||
			tok == SWITCH ||
			tok == FOR ||
			tok == IF ||
			tok == WHILE ||
			tok == FUNC) {
			total++;
		}
		tok = GetNextToken(lexer);
	}
	DestroyLexer(lexer);
	return total;
}